

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_unsigned_int> google::protobuf::internal::ReadTagFallback(char *p,uint32_t res)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  pair<const_char_*,_unsigned_int> pVar4;
  
  uVar2 = (ulong)res;
  pcVar1 = p + 3;
  lVar3 = -0x15;
  do {
    uVar2 = (ulong)(((byte)pcVar1[-1] - 1 << ((char)lVar3 + 0x23U & 0x1f)) + (int)uVar2);
    if (-1 < pcVar1[-1]) goto LAB_003255ac;
    pcVar1 = pcVar1 + 1;
    lVar3 = lVar3 + 7;
  } while (lVar3 != 0);
  uVar2 = 0;
  pcVar1 = (char *)0x0;
LAB_003255ac:
  pVar4._8_8_ = uVar2;
  pVar4.first = pcVar1;
  return pVar4;
}

Assistant:

std::pair<const char*, uint32_t> ReadTagFallback(const char* p, uint32_t res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}